

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.hpp
# Opt level: O0

void __thiscall libtorrent::aux::listen_socket_t::listen_socket_t(listen_socket_t *this)

{
  listen_socket_t *this_local;
  
  utp_socket_interface::utp_socket_interface(&this->super_utp_socket_interface);
  (this->super_utp_socket_interface)._vptr_utp_socket_interface =
       (_func_int **)&PTR_get_local_endpoint_00b8fe98;
  ip_voter::ip_voter(&this->external_address);
  boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint(&this->local_endpoint);
  boost::asio::ip::address::address(&this->netmask);
  ::std::__cxx11::string::string((string *)&this->device);
  this->original_port = 0;
  container_wrapper<libtorrent::aux::listen_port_mapping,_libtorrent::portmap_transport,_std::array<libtorrent::aux::listen_port_mapping,_2UL>_>
  ::container_wrapper(&this->tcp_port_mapping);
  container_wrapper<libtorrent::aux::listen_port_mapping,_libtorrent::portmap_transport,_std::array<libtorrent::aux::listen_port_mapping,_2UL>_>
  ::container_wrapper(&this->udp_port_mapping);
  this->ssl = plaintext;
  (this->flags).m_val = '\x01';
  ::std::
  shared_ptr<boost::asio::basic_socket_acceptor<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  ::shared_ptr(&this->sock);
  ::std::shared_ptr<libtorrent::aux::session_udp_socket>::shared_ptr(&this->udp_sock);
  ::std::shared_ptr<libtorrent::natpmp>::shared_ptr(&this->natpmp_mapper);
  ::std::shared_ptr<libtorrent::upnp>::shared_ptr(&this->upnp_mapper);
  ::std::shared_ptr<libtorrent::aux::lsd>::shared_ptr(&this->lsd);
  this->incoming_connection = false;
  return;
}

Assistant:

listen_socket_t() = default;